

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

deUint32 vkt::anon_unknown_0::getShaderStages(ShaderCaseSpecification *spec)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  int local_2c;
  ulong uStack_28;
  int shaderType;
  size_t progNdx;
  deUint32 stages;
  ShaderCaseSpecification *spec_local;
  
  if (spec->caseType == CASETYPE_COMPLETE) {
    progNdx._4_4_ = 0;
    uStack_28 = 0;
    while( true ) {
      sVar2 = std::
              vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
              ::size(&spec->programs);
      if (sVar2 <= uStack_28) break;
      for (local_2c = 0; local_2c < 6; local_2c = local_2c + 1) {
        pvVar3 = std::
                 vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                 ::operator[](&spec->programs,uStack_28);
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((pvVar3->sources).sources + local_2c);
        if (!bVar1) {
          progNdx._4_4_ = 1 << ((byte)local_2c & 0x1f) | progNdx._4_4_;
        }
      }
      uStack_28 = uStack_28 + 1;
    }
    spec_local._4_4_ = progNdx._4_4_;
  }
  else {
    spec_local._4_4_ = 3;
  }
  return spec_local._4_4_;
}

Assistant:

deUint32 getShaderStages (const ShaderCaseSpecification& spec)
{
	if (spec.caseType == glu::sl::CASETYPE_COMPLETE)
	{
		deUint32	stages	= 0u;

		for (size_t progNdx = 0; progNdx < spec.programs.size(); progNdx++)
		{
			for (int shaderType = 0; shaderType < glu::SHADERTYPE_LAST; shaderType++)
			{
				if (!spec.programs[progNdx].sources.sources[shaderType].empty())
					stages |= (1u << shaderType);
			}
		}

		return stages;
	}
	else
		return (1u << glu::SHADERTYPE_VERTEX) | (1u << glu::SHADERTYPE_FRAGMENT);
}